

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  uint uVar2;
  LookasideSlot *pLVar3;
  ulong uVar4;
  u32 uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  LookasideSlot *pLVar10;
  u64 n;
  LookasideSlot *p;
  LookasideSlot *pLVar11;
  
  iVar1 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar1) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar2 = sz & 0xfffffff8;
  uVar8 = 0xfff8;
  if (uVar2 < 0xfff8) {
    uVar8 = uVar2;
  }
  uVar4 = 0;
  uVar6 = (ulong)uVar8;
  if ((int)uVar2 < 9) {
    uVar6 = uVar4;
  }
  if (0 < cnt) {
    uVar4 = (ulong)(uint)cnt;
  }
  if (cnt < 1 || (int)uVar6 == 0) {
    (db->lookaside).szTrue = 0;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
  }
  else {
    n = uVar4 * uVar6;
    pLVar3 = (LookasideSlot *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pLVar3 = (LookasideSlot *)sqlite3Malloc(n);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pLVar3 == (LookasideSlot *)0x0) {
        pLVar3 = (LookasideSlot *)0x0;
      }
      else {
        iVar1 = (*sqlite3Config.m.xSize)(pLVar3);
        n = (u64)iVar1;
      }
    }
    if ((uint)sz < 0x180) {
      if (0xff < (uint)sz) {
        uVar2 = uVar8 + 0x80;
        goto LAB_0012c52c;
      }
      uVar4 = (long)n / (long)(ulong)uVar8;
      uVar6 = 0;
    }
    else {
      uVar2 = uVar8 + 0x180;
LAB_0012c52c:
      uVar4 = (long)n / (long)(ulong)uVar2;
      lVar7 = (long)(int)uVar4 * (ulong)uVar8;
      uVar9 = n - lVar7;
      uVar6 = (n - lVar7) + 0x7f;
      if (-1 < (long)uVar9) {
        uVar6 = uVar9;
      }
      uVar6 = uVar6 >> 7;
    }
    (db->lookaside).pStart = pLVar3;
    (db->lookaside).pInit = (LookasideSlot *)0x0;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar8;
    (db->lookaside).szTrue = (u16)uVar8;
    if (pLVar3 != (LookasideSlot *)0x0) {
      if (0 < (int)uVar4) {
        uVar9 = uVar4 & 0xffffffff;
        pLVar10 = (LookasideSlot *)0x0;
        pLVar11 = pLVar3;
        do {
          pLVar11->pNext = pLVar10;
          pLVar3 = (LookasideSlot *)((long)&pLVar11->pNext + (ulong)uVar8);
          uVar2 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar2;
          pLVar10 = pLVar11;
          pLVar11 = pLVar3;
        } while (uVar2 != 0);
        (db->lookaside).pInit = (LookasideSlot *)((long)pLVar3 - (ulong)uVar8);
      }
      (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
      (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
      (db->lookaside).pMiddle = pLVar3;
      if (0 < (int)uVar6) {
        uVar9 = uVar6 & 0xffffffff;
        pLVar10 = (LookasideSlot *)0x0;
        do {
          pLVar11 = pLVar3;
          pLVar11->pNext = pLVar10;
          pLVar3 = pLVar11 + 0x10;
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
          pLVar10 = pLVar11;
        } while (uVar8 != 0);
        (db->lookaside).pSmallInit = pLVar11;
      }
      (db->lookaside).pEnd = pLVar3;
      (db->lookaside).bDisable = 0;
      (db->lookaside).bMalloced = pBuf == (void *)0x0;
      uVar5 = (int)uVar6 + (int)uVar4;
      goto LAB_0012c64b;
    }
  }
  (db->lookaside).pEnd = (void *)0x0;
  (db->lookaside).pMiddle = (void *)0x0;
  (db->lookaside).pStart = (void *)0x0;
  (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
  (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
  (db->lookaside).bDisable = 1;
  (db->lookaside).sz = 0;
  (db->lookaside).bMalloced = '\0';
  uVar5 = 0;
  pLVar3 = (LookasideSlot *)0x0;
LAB_0012c64b:
  (db->lookaside).nSlot = uVar5;
  (db->lookaside).pTrueEnd = pLVar3;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( sz>65528 ) sz = 65528;
  if( cnt<0 ) cnt = 0;
  szAlloc = (i64)sz*(i64)cnt;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = 0;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = 0;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = 0;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  db->lookaside.pTrueEnd = db->lookaside.pEnd;
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}